

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

bool __thiscall AmpIO::WriteMotorCurrentLimit(AmpIO *this,uint index,uint16_t mcurlim)

{
  BasePort *pBVar1;
  bool bVar2;
  uint32_t uVar3;
  int iVar4;
  uint channel;
  uint32_t cfg;
  bool ret;
  uint16_t mcurlim_local;
  uint index_local;
  AmpIO *this_local;
  
  channel._1_1_ = false;
  uVar3 = BoardIO::GetFirmwareVersion((BoardIO *)this);
  if (uVar3 < 8) {
    this_local._7_1_ = false;
  }
  else if (mcurlim < 0x8000) {
    bVar2 = HasQLA(this);
    if (((bVar2) && ((this->super_FpgaIO).super_BoardIO.port != (BasePort *)0x0)) &&
       (index < this->NumMotors)) {
      pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
      iVar4 = (*pBVar1->_vptr_BasePort[0x24])
                        (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,
                         (ulong)((index + 1) * 0x10 | 0xb),(ulong)(mcurlim | 0x1000000));
      channel._1_1_ = (bool)((byte)iVar4 & 1);
    }
    this_local._7_1_ = channel._1_1_;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AmpIO::WriteMotorCurrentLimit(unsigned int index, uint16_t mcurlim)
{
    bool ret = false;
    if (GetFirmwareVersion() < 8) return ret;
    // Return false if motor current limit exceeds maximum range (rather
    // than allowing firmware to set msb to 0).
    if (mcurlim > 0x7fff) return ret;

    if (HasQLA() && port && (index < NumMotors)) {
        uint32_t cfg = MCFG_SET_CUR_LIMIT | mcurlim;
        unsigned int channel = (index+1) << 4;
        ret = port->WriteQuadlet(BoardId, channel | MOTOR_CONFIG_REG, cfg);
    }
    return ret;
}